

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O2

bool __thiscall helics::GlobalTimeCoordinator::updateTimeFactors(GlobalTimeCoordinator *this)

{
  TimeDependencies *dependencies;
  int32_t *piVar1;
  GlobalFederateId sourceId;
  long lVar2;
  pointer pDVar3;
  bool bVar4;
  int iVar5;
  Time me;
  ostream *poVar6;
  long lVar7;
  DependencyInfo *dep;
  pointer pDVar8;
  byte bVar9;
  Time TVar10;
  const_iterator __begin1;
  DependencyInfo *dep_2;
  TimeData timeStream;
  ActionMessage updateTime;
  
  dependencies = &(this->super_BaseTimeCoordinator).dependencies;
  generateMinTimeUpstream
            (&timeStream,dependencies,true,
             (GlobalFederateId)(this->super_BaseTimeCoordinator).mSourceId.gid,
             (GlobalFederateId)0x8831d580,0);
  if (timeStream.mTimeState == time_granted) {
    this->currentTimeState = time_granted;
    (this->currentMinTime).internalTimeCode = timeStream.next.internalTimeCode;
    (this->nextEvent).internalTimeCode = timeStream.next.internalTimeCode;
  }
  else if (timeStream.mTimeState == time_requested) {
    if (this->currentTimeState == time_requested) {
      lVar7 = (this->nextEvent).internalTimeCode;
      TVar10.internalTimeCode = lVar7 + 1;
      if (lVar7 == 0x7fffffffffffffff) {
        TVar10.internalTimeCode = 0x7fffffffffffffff;
      }
      bVar4 = TimeDependencies::verifySequenceCounter
                        (dependencies,TVar10,(this->super_BaseTimeCoordinator).sequenceCounter);
      pDVar8 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (!bVar4) {
        for (; pDVar8 != pDVar3; pDVar8 = pDVar8 + 1) {
          if (((pDVar8->updateRequested == false) &&
              (lVar7 = (pDVar8->super_TimeData).next.internalTimeCode,
              lVar7 != 0x7fffffffffffffff && lVar7 <= TVar10.internalTimeCode)) &&
             (bVar4 = checkSequenceCounter
                                (pDVar8,TVar10,(this->super_BaseTimeCoordinator).sequenceCounter),
             !bVar4)) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"sequence check but no request");
            std::endl<char,std::char_traits<char>>(poVar6);
          }
        }
        goto LAB_002986aa;
      }
      bVar9 = 0;
      lVar7 = 0x7fffffffffffffff;
      for (; pDVar8 != pDVar3; pDVar8 = pDVar8 + 1) {
        if ((TVar10.internalTimeCode < (pDVar8->super_TimeData).next.internalTimeCode) ||
           (pDVar8->nonGranting != true)) {
          lVar2 = (pDVar8->super_TimeData).Te.internalTimeCode;
          if (lVar2 < lVar7) {
            lVar7 = lVar2;
          }
        }
        else {
          bVar9 = bVar9 | pDVar8->triggered;
        }
      }
      TVar10.internalTimeCode = lVar7 + 1;
      if (lVar7 == 0x7fffffffffffffff) {
        TVar10.internalTimeCode = 0x7fffffffffffffff;
      }
      lVar2 = (this->nextEvent).internalTimeCode;
      (this->nextEvent).internalTimeCode = lVar7;
      if (lVar2 < lVar7) {
        bVar4 = TimeDependencies::verifySequenceCounter
                          (dependencies,TVar10,(this->super_BaseTimeCoordinator).sequenceCounter);
        bVar4 = !bVar4;
      }
      else {
        bVar4 = false;
      }
      if (((bVar9 & 1) == 0 && !bVar4) && (this->mNewRequest != true)) {
        sourceId.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
        ActionMessage::ActionMessage(&updateTime,cmd_time_request,sourceId,sourceId);
        iVar5 = (this->super_BaseTimeCoordinator).sequenceCounter + 1;
        (this->super_BaseTimeCoordinator).sequenceCounter = iVar5;
        updateTime.counter = (uint16_t)iVar5;
        pDVar3 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        updateTime.actionTime.internalTimeCode = TVar10.internalTimeCode;
        updateTime.Te.internalTimeCode = TVar10.internalTimeCode;
        updateTime.Tdemin.internalTimeCode = TVar10.internalTimeCode;
        for (pDVar8 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start; pDVar8 != pDVar3;
            pDVar8 = pDVar8 + 1) {
          lVar7 = (pDVar8->super_TimeData).next.internalTimeCode;
          if (lVar7 != 0x7fffffffffffffff && lVar7 <= TVar10.internalTimeCode) {
            updateTime.dest_id.gid = (pDVar8->fedID).gid;
            updateTime.source_handle.hid = (pDVar8->super_TimeData).sequenceCounter;
            std::function<void_(const_helics::ActionMessage_&)>::operator()
                      (&(this->super_BaseTimeCoordinator).sendMessageFunction,&updateTime);
          }
        }
        this->currentTimeState = time_granted;
        (this->currentMinTime).internalTimeCode = timeStream.Te.internalTimeCode;
        (this->nextEvent).internalTimeCode = timeStream.Te.internalTimeCode;
        ActionMessage::~ActionMessage(&updateTime);
        goto LAB_002986aa;
      }
      piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
      *piVar1 = *piVar1 + 1;
      this->mNewRequest = false;
    }
    else {
      if (this->currentTimeState != time_granted) goto LAB_002986aa;
      this->currentTimeState = time_requested;
      (this->currentMinTime).internalTimeCode = timeStream.next.internalTimeCode;
      lVar7 = 0x7fffffffffffffff;
      for (pDVar8 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar8 != (this->super_BaseTimeCoordinator).dependencies.dependencies.
                    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pDVar8 = pDVar8 + 1) {
        if ((pDVar8->nonGranting == false) &&
           (lVar2 = (pDVar8->super_TimeData).Te.internalTimeCode, lVar2 < lVar7)) {
          lVar7 = lVar2;
        }
      }
      (this->nextEvent).internalTimeCode = lVar7;
      piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
      *piVar1 = *piVar1 + 1;
      TVar10.internalTimeCode = lVar7 + 1;
      if (lVar7 == 0x7fffffffffffffff) {
        TVar10.internalTimeCode = 0x7fffffffffffffff;
      }
      this->mNewRequest = false;
    }
    sendTimeUpdateRequest(this,TVar10);
  }
LAB_002986aa:
  return timeStream.mTimeState != time_granted;
}

Assistant:

bool GlobalTimeCoordinator::updateTimeFactors()
{
    auto timeStream = generateMinTimeUpstream(dependencies, true, mSourceId, NoIgnoredFederates, 0);
    if (timeStream.mTimeState == TimeState::time_granted) {
        currentTimeState = TimeState::time_granted;
        currentMinTime = timeStream.next;
        nextEvent = timeStream.next;
        return false;
    }
    if (timeStream.mTimeState == TimeState::time_requested) {
        if (currentTimeState == TimeState::time_granted) {
            currentTimeState = TimeState::time_requested;
            currentMinTime = timeStream.next;
            nextEvent = findNextTriggerEvent(dependencies);
            ++sequenceCounter;
            auto trigTime = (nextEvent < cBigTime) ? nextEvent + Time::epsilon() : nextEvent;
            mNewRequest = false;
            sendTimeUpdateRequest(trigTime);
            return true;
        }
        if (currentTimeState == TimeState::time_requested) {
            auto trigTime = (nextEvent < cBigTime) ? nextEvent + Time::epsilon() : nextEvent;
            if (dependencies.verifySequenceCounter(trigTime, sequenceCounter)) {
                auto trig = checkForTriggered(dependencies, trigTime);
                bool verified{trig.second <= nextEvent};
                nextEvent = trig.second;
                trigTime = (nextEvent < cBigTime) ? nextEvent + Time::epsilon() : nextEvent;
                if (!verified) {
                    verified = dependencies.verifySequenceCounter(trigTime, sequenceCounter);
                }

                if (trig.first || !verified || mNewRequest) {
                    ++sequenceCounter;
                    mNewRequest = false;
                    sendTimeUpdateRequest(trigTime);
                    return true;
                }
                ActionMessage updateTime(CMD_TIME_REQUEST, mSourceId, mSourceId);
                updateTime.actionTime = trigTime;
                updateTime.Te = trigTime;
                updateTime.Tdemin = trigTime;

                ++sequenceCounter;
                updateTime.counter = sequenceCounter;
                for (const auto& dep : dependencies) {
                    if (dep.next <= trigTime && dep.next < cBigTime) {
                        updateTime.dest_id = dep.fedID;
                        updateTime.setExtraDestData(dep.sequenceCounter);
                        sendMessageFunction(updateTime);
                    }
                }
                currentTimeState = TimeState::time_granted;
                currentMinTime = timeStream.Te;
                nextEvent = timeStream.Te;
            } else {
                for (auto& dep : dependencies) {
                    if (dep.updateRequested) {
                        continue;
                    }
                    if (dep.next <= trigTime && dep.next < cBigTime) {
                        if (!checkSequenceCounter(dep, trigTime, sequenceCounter)) {
                            std::cerr << "sequence check but no request" << std::endl;
                            /* ActionMessage updateTime(CMD_REQUEST_CURRENT_TIME,
                                                       mSourceId,
                                                       mSourceId);
                              updateTime.counter = sequenceCounter;

                              updateTime.dest_id = dep.fedID;
                              updateTime.setExtraDestData(dep.sequenceCounter);
                              dep.updateRequested = true;
                              sendMessageFunction(updateTime);
                              */
                        }
                    }
                }
            }
        }
    }
    return true;
}